

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall QTabBar::mouseDoubleClickEvent(QTabBar *this,QMouseEvent *event)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int _t1;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_28 = QPointF::toPoint(&local_38);
  lVar2 = *(long *)(*(long *)(lVar1 + 0x290) + 0x20);
  if ((*(byte *)(lVar2 + 10) & 1) == 0) {
    cVar3 = QRect::contains((QPoint *)(lVar2 + 0x14),SUB81(&local_28,0));
    if (cVar3 != '\0') goto LAB_0045228c;
  }
  lVar1 = *(long *)(*(long *)(lVar1 + 0x288) + 0x20);
  if ((*(byte *)(lVar1 + 10) & 1) == 0) {
    cVar3 = QRect::contains((QPoint *)(lVar1 + 0x14),SUB81(&local_28,0));
    if (cVar3 != '\0') goto LAB_0045228c;
  }
  _t1 = tabAt(this,&local_28);
  tabBarDoubleClicked(this,_t1);
LAB_0045228c:
  (**(code **)(*(long *)&this->super_QWidget + 0x98))(this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTabBar);
    const QPoint pos = event->position().toPoint();
    const bool isEventInCornerButtons = (!d->leftB->isHidden() && d->leftB->geometry().contains(pos))
                                        || (!d->rightB->isHidden() && d->rightB->geometry().contains(pos));
    if (!isEventInCornerButtons)
        emit tabBarDoubleClicked(tabAt(pos));

    mousePressEvent(event);
}